

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O0

void __thiscall
CompletionProvider::registerCapabilities(CompletionProvider *this,ServerCapabilities *capabilities)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  CompletionOptions *pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  allocator<char> local_166;
  allocator<char> local_165;
  allocator<char> local_164;
  allocator<char> local_163;
  allocator<char> local_162;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  iterator local_98;
  size_type local_90;
  CompletionOptions local_78;
  optional<Init::CompletionOptions> local_48;
  ServerCapabilities *local_18;
  ServerCapabilities *capabilities_local;
  CompletionProvider *this_local;
  
  local_18 = capabilities;
  capabilities_local = (ServerCapabilities *)this;
  bVar1 = ::optional::operator_cast_to_bool((optional *)&capabilities->completionProvider);
  if (!bVar1) {
    local_78.triggerCharacters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.triggerCharacters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super_Reflectable._vptr_Reflectable = (_func_int **)0x0;
    local_78.resolveProvider = false;
    local_78._9_7_ = 0;
    local_78.triggerCharacters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Init::CompletionOptions::CompletionOptions(&local_78);
    optional<Init::CompletionOptions>::optional(&local_48,&local_78);
    optional<Init::CompletionOptions>::operator=(&local_18->completionProvider,&local_48);
    optional<Init::CompletionOptions>::~optional(&local_48);
    Init::CompletionOptions::~CompletionOptions(&local_78);
  }
  local_160 = &local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"\\",&local_161);
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"@",&local_162);
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"!",&local_163);
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"$",&local_164);
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"#",&local_165);
  local_160 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"&",&local_166);
  local_98 = &local_158;
  local_90 = 6;
  pCVar2 = optional<Init::CompletionOptions>::operator->(&local_18->completionProvider);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&pCVar2->triggerCharacters,__l);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
  do {
    local_1e0 = local_1e0 + -1;
    std::__cxx11::string::~string((string *)local_1e0);
  } while (local_1e0 != &local_158);
  std::allocator<char>::~allocator(&local_166);
  std::allocator<char>::~allocator(&local_165);
  std::allocator<char>::~allocator(&local_164);
  std::allocator<char>::~allocator(&local_163);
  std::allocator<char>::~allocator(&local_162);
  std::allocator<char>::~allocator(&local_161);
  return;
}

Assistant:

void CompletionProvider::registerCapabilities (Init::ServerCapabilities &capabilities) {
    if (!capabilities.completionProvider) capabilities.completionProvider = Init::CompletionOptions {};

    /*
     * \ - command
     * @ - citation
     * ! - magic comment
     * $ - math shift
     * # - reference (planned)
     * & - environment (planned)
     */
    capabilities.completionProvider->triggerCharacters = { "\\", "@", "!", "$", "#", "&" };
}